

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O2

void BrotliZopfliCreateCommands
               (size_t num_bytes,size_t block_start,ZopfliNode *nodes,int *dist_cache,
               size_t *last_insert_len,BrotliEncoderParams *params,Command_conflict *commands,
               size_t *num_literals)

{
  uint32_t uVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  ushort uVar5;
  ushort uVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  uint32_t uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  ushort uVar20;
  long lVar21;
  uint16_t *puVar22;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  
  uVar8 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  sVar3 = params->stream_offset;
  puVar22 = &commands->dist_prefix_;
  lVar23 = 0;
  lVar21 = 0;
  uVar10 = (nodes->u).next;
  while (uVar10 != 0xffffffff) {
    uVar15 = nodes[lVar21 + (ulong)uVar10].length;
    uVar16 = nodes[lVar21 + (ulong)uVar10].dcode_insert_length;
    uVar11 = (ulong)(uVar16 & 0x7ffffff);
    uVar1 = nodes[lVar21 + (ulong)uVar10].u.next;
    bVar25 = lVar23 == 0;
    lVar23 = lVar23 + -1;
    uVar9 = uVar11;
    if (bVar25) {
      uVar9 = *last_insert_len + uVar11;
      *last_insert_len = 0;
    }
    uVar17 = uVar15 & 0x1ffffff;
    uVar2 = nodes[lVar21 + (ulong)uVar10].distance;
    iVar13 = uVar17 - (uVar15 >> 0x19);
    uVar14 = iVar13 + 9;
    uVar12 = block_start + sVar3 + lVar21 + uVar11;
    if (uVar8 <= uVar12) {
      uVar12 = uVar8;
    }
    uVar4 = (uVar16 >> 0x1b) - 1;
    if (uVar16 < 0x8000000) {
      uVar4 = uVar2 + 0xf;
    }
    ((Command_conflict *)(puVar22 + -7))->insert_len_ = (uint32_t)uVar9;
    *(uint *)(puVar22 + -5) = (uVar14 - uVar15) * 0x2000000 | uVar17;
    uVar24 = (ulong)(params->dist).num_direct_distance_codes;
    uVar18 = uVar24 + 0x10;
    if (uVar4 < uVar18) {
      uVar10 = 0;
      uVar20 = (ushort)uVar4;
    }
    else {
      uVar10 = (params->dist).distance_postfix_bits;
      bVar7 = (byte)uVar10;
      uVar24 = ((uVar4 - uVar24) + (4L << (bVar7 & 0x3f))) - 0x10;
      uVar15 = 0x1f;
      if ((uint)uVar24 != 0) {
        for (; (uint)uVar24 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      uVar15 = (uVar15 ^ 0xffffffe0) + 0x1f;
      bVar25 = (uVar24 >> ((ulong)uVar15 & 0x3f) & 1) != 0;
      iVar19 = uVar15 - uVar10;
      uVar20 = (short)((uint)bVar25 + iVar19 * 2 + 0xfffe << (bVar7 & 0x3f)) +
               (short)uVar18 + (~(ushort)(-1 << (bVar7 & 0x1f)) & (ushort)uVar24) |
               (short)iVar19 * 0x400;
      uVar10 = (uint32_t)(uVar24 - ((ulong)bVar25 + 2 << ((byte)uVar15 & 0x3f)) >> (bVar7 & 0x3f));
    }
    *puVar22 = uVar20;
    *(uint32_t *)(puVar22 + -3) = uVar10;
    if (uVar9 < 6) {
      uVar18 = uVar9 & 0xffffffff;
    }
    else if (uVar9 < 0x82) {
      uVar15 = 0x1f;
      uVar16 = (uint)(uVar9 - 2);
      if (uVar16 != 0) {
        for (; uVar16 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      uVar18 = (ulong)((int)(uVar9 - 2 >> ((char)(uVar15 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar15 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (uVar9 < 0x842) {
      uVar16 = (uint32_t)uVar9 - 0x42;
      uVar15 = 0x1f;
      if (uVar16 != 0) {
        for (; uVar16 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      uVar18 = (ulong)((uVar15 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar18 = 0x15;
      if (0x1841 < uVar9) {
        uVar18 = (ulong)(ushort)(0x17 - (uVar9 < 0x5842));
      }
    }
    if (uVar14 < 10) {
      uVar15 = iVar13 + 7;
    }
    else if (uVar14 < 0x86) {
      uVar16 = iVar13 + 3;
      uVar15 = 0x1f;
      if (uVar16 != 0) {
        for (; uVar16 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      uVar15 = (int)((ulong)(long)(int)uVar16 >> ((char)(uVar15 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar15 ^ 0xffffffe0) * 2 + 0x42;
    }
    else {
      uVar15 = 0x17;
      if (uVar14 < 0x846) {
        uVar15 = 0x1f;
        if (iVar13 - 0x3dU != 0) {
          for (; iVar13 - 0x3dU >> uVar15 == 0; uVar15 = uVar15 - 1) {
          }
        }
        uVar15 = (uVar15 ^ 0xffe0) + 0x2c;
      }
    }
    uVar5 = (ushort)uVar15;
    uVar6 = (uVar5 & 7) + ((ushort)uVar18 & 7) * 8;
    if ((((uVar20 & 0x3ff) == 0) && ((ushort)uVar18 < 8)) && (uVar5 < 0x10)) {
      if (7 < uVar5) {
        uVar6 = uVar6 + 0x40;
      }
    }
    else {
      iVar13 = (int)((uVar18 & 0xffff) >> 3) * 3 + ((uVar15 & 0xffff) >> 3);
      uVar6 = uVar6 + ((ushort)(0x520d40 >> ((char)iVar13 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar13 * 0x40 + 0x40;
    }
    puVar22[-1] = uVar6;
    if ((uVar2 <= uVar12) && (uVar4 != 0)) {
      dist_cache[3] = dist_cache[2];
      *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
      *dist_cache = uVar2;
    }
    *num_literals = *num_literals + uVar9;
    lVar21 = lVar21 + uVar11 + (ulong)uVar17;
    puVar22 = puVar22 + 8;
    uVar10 = uVar1;
  }
  *last_insert_len = *last_insert_len + (num_bytes - lVar21);
  return;
}

Assistant:

void BrotliZopfliCreateCommands(const size_t num_bytes,
    const size_t block_start, const ZopfliNode* nodes, int* dist_cache,
    size_t* last_insert_len, const BrotliEncoderParams* params,
    Command* commands, size_t* num_literals) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  size_t pos = 0;
  uint32_t offset = nodes[0].u.next;
  size_t i;
  size_t gap = 0;
  for (i = 0; offset != BROTLI_UINT32_MAX; i++) {
    const ZopfliNode* next = &nodes[pos + offset];
    size_t copy_length = ZopfliNodeCopyLength(next);
    size_t insert_length = next->dcode_insert_length & 0x7FFFFFF;
    pos += insert_length;
    offset = next->u.next;
    if (i == 0) {
      insert_length += *last_insert_len;
      *last_insert_len = 0;
    }
    {
      size_t distance = ZopfliNodeCopyDistance(next);
      size_t len_code = ZopfliNodeLengthCode(next);
      size_t dictionary_start = BROTLI_MIN(size_t,
          block_start + pos + stream_offset, max_backward_limit);
      BROTLI_BOOL is_dictionary =
          TO_BROTLI_BOOL(distance > dictionary_start + gap);
      size_t dist_code = ZopfliNodeDistanceCode(next);
      InitCommand(&commands[i], &params->dist, insert_length,
          copy_length, (int)len_code - (int)copy_length, dist_code);

      if (!is_dictionary && dist_code > 0) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = dist_cache[0];
        dist_cache[0] = (int)distance;
      }
    }

    *num_literals += insert_length;
    pos += copy_length;
  }
  *last_insert_len += num_bytes - pos;
}